

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O1

void __thiscall randomx::JitCompilerX86::h_IROR_R(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint8_t *puVar1;
  int iVar2;
  byte bVar3;
  
  bVar3 = instr->dst;
  this->registerUsage[bVar3] = i;
  if (instr->src == bVar3) {
    puVar1 = this->code + this->codePos;
    puVar1[0] = 'I';
    puVar1[1] = 0xc1;
    iVar2 = this->codePos + 2;
    this->codePos = iVar2;
    this->code[iVar2] = instr->dst + 200;
    iVar2 = this->codePos + 1;
    this->codePos = iVar2;
    bVar3 = (byte)instr->imm32 & 0x3f;
  }
  else {
    puVar1 = this->code + this->codePos;
    puVar1[0] = 'A';
    puVar1[1] = 0x8b;
    iVar2 = this->codePos + 2;
    this->codePos = iVar2;
    this->code[iVar2] = instr->src + 200;
    iVar2 = this->codePos;
    this->codePos = iVar2 + 1;
    puVar1 = this->code;
    (puVar1 + (long)iVar2 + 1)[0] = 'I';
    (puVar1 + (long)iVar2 + 1)[1] = 0xd3;
    iVar2 = this->codePos + 2;
    this->codePos = iVar2;
    bVar3 = instr->dst - 0x38;
  }
  this->code[iVar2] = bVar3;
  this->codePos = this->codePos + 1;
  return;
}

Assistant:

void JitCompilerX86::h_IROR_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			emit(REX_MOV_RR);
			emitByte(0xc8 + instr.src);
			emit(REX_ROT_CL);
			emitByte(0xc8 + instr.dst);
		}
		else {
			emit(REX_ROT_I8);
			emitByte(0xc8 + instr.dst);
			emitByte(instr.getImm32() & 63);
		}
	}